

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

int __thiscall
CVmObjClass::get_prop_from_mod
          (CVmObjClass *this,vm_prop_id_t prop,vm_val_t *val,vm_obj_id_t self,
          vm_obj_id_t *source_obj,uint *argc)

{
  uint uVar1;
  int iVar2;
  
  while( true ) {
    uVar1 = *(uint *)(*(long *)((long)&((CVmObjPageEntry *)this)->ptr_ + 8) + 4);
    if ((uVar1 != 0) &&
       (iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 0x68
                            ))(G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),prop,val,uVar1,
                               source_obj,argc), iVar2 != 0)) {
      return 1;
    }
    iVar2 = (**(code **)(*(long *)&((CVmObjPageEntry *)this)->ptr_ + 0x40))(this,self);
    if (iVar2 == 0) {
      return 0;
    }
    self = (**(code **)(*(long *)&((CVmObjPageEntry *)this)->ptr_ + 0x48))(this,self,0);
    if (self == 0) break;
    this = (CVmObjClass *)(G_obj_table_X.pages_[self >> 0xc] + (self & 0xfff));
  }
  return 0;
}

Assistant:

int CVmObjClass::get_prop_from_mod(VMG_ vm_prop_id_t prop, vm_val_t *val,
                                   vm_obj_id_t self, vm_obj_id_t *source_obj,
                                   uint *argc)
{
    vm_obj_id_t sc;
    vm_obj_id_t mod_obj;

    /* if we have a modifier object, look it up in the modifier */
    if ((mod_obj = get_mod_obj()) != VM_INVALID_OBJ
        && vm_objp(vmg_ mod_obj)->get_prop(vmg_ prop, val, mod_obj,
                                           source_obj, argc))
    {
        /* got it - return it from the modifier */
        return TRUE;
    }

    /* 
     *   it's not in our modifier(s); check with any intrinsic superclass
     *   modifiers 
     */
    if (get_superclass_count(vmg_ self) != 0
        && (sc = get_superclass(vmg_ self, 0)) != VM_INVALID_OBJ)
    {
        /* we have a superclass - check it recursively */
        return ((CVmObjClass *)vm_objp(vmg_ sc))
            ->get_prop_from_mod(vmg_ prop, val, sc, source_obj, argc);
    }

    /* 
     *   we didn't find it, and we have no superclass, so there's nowhere
     *   else to look - return failure 
     */
    return FALSE;
}